

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

void __thiscall Moc::parseInterfaces(Moc *this,ClassDef *def)

{
  long lVar1;
  int iVar2;
  QArrayData *pQVar3;
  long lVar4;
  iterator iVar5;
  pointer pIVar6;
  Symbol *pSVar7;
  long lVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QByteArray local_a8;
  Interface local_88;
  QArrayDataPointer<ClassDef::Interface> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = (this->super_Parser).symbols.d.size;
  lVar4 = (this->super_Parser).index;
  if ((lVar4 < lVar8) && ((this->super_Parser).symbols.d.ptr[lVar4].token == LPAREN)) {
    lVar4 = lVar4 + 1;
    (this->super_Parser).index = lVar4;
    if ((lVar4 < lVar8) &&
       (pSVar7 = (this->super_Parser).symbols.d.ptr, pSVar7[lVar4].token == IDENTIFIER)) {
LAB_0011cc7e:
      (this->super_Parser).index = lVar4 + 1;
      local_58.d = (Data *)0x0;
      local_58.ptr = (Interface *)0x0;
      local_58.size = 0;
      QByteArray::mid((longlong)&local_a8,(longlong)&pSVar7[lVar4].lex);
      local_88.className.d.d = local_a8.d.d;
      local_88.className.d.ptr = local_a8.d.ptr;
      local_88.className.d.size = local_a8.d.size;
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_88.interfaceId.d.d = (Data *)0x0;
      local_88.interfaceId.d.ptr = (char *)0x0;
      local_88.interfaceId.d.size = 0;
      QtPrivate::QMovableArrayOps<ClassDef::Interface>::emplace<ClassDef::Interface>
                ((QMovableArrayOps<ClassDef::Interface> *)&local_58,local_58.size,&local_88);
      QList<ClassDef::Interface>::end((QList<ClassDef::Interface> *)&local_58);
      if (&(local_88.interfaceId.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.interfaceId.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.interfaceId.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_88.interfaceId.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_88.interfaceId.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_88.className.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_88.className.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_a8.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0011cd5c;
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar2 = ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar3 = &(local_a8.d.d)->super_QArrayData;
      do {
        if (iVar2 == 0) {
          QArrayData::deallocate(pQVar3,1,0x10);
        }
LAB_0011cd5c:
        do {
          lVar8 = (this->super_Parser).symbols.d.size;
          lVar4 = (this->super_Parser).index;
          if ((lVar8 <= lVar4) ||
             (pSVar7 = (this->super_Parser).symbols.d.ptr, pSVar7[lVar4].token != SCOPE))
          goto LAB_0011d07a;
          (this->super_Parser).index = lVar4 + 1;
          QByteArray::mid((longlong)&local_88,(longlong)&pSVar7[lVar4].lex);
          iVar5 = QList<ClassDef::Interface>::end((QList<ClassDef::Interface> *)&local_58);
          QByteArray::append(&iVar5.i[-1].className);
          if (&(local_88.className.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_88.className.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_88.className.d.d)->super_QArrayData,1,0x10);
            }
          }
          lVar8 = (this->super_Parser).index;
          if (((this->super_Parser).symbols.d.size <= lVar8) ||
             (pSVar7 = (this->super_Parser).symbols.d.ptr, pSVar7[lVar8].token != IDENTIFIER))
          goto LAB_0011d200;
          (this->super_Parser).index = lVar8 + 1;
          QByteArray::mid((longlong)&local_88,(longlong)&pSVar7[lVar8].lex);
          iVar5 = QList<ClassDef::Interface>::end((QList<ClassDef::Interface> *)&local_58);
          QByteArray::append(&iVar5.i[-1].className);
        } while (&(local_88.className.d.d)->super_QArrayData == (QArrayData *)0x0);
        LOCK();
        ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        iVar2 = ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i;
        UNLOCK();
        pQVar3 = &(local_88.className.d.d)->super_QArrayData;
      } while( true );
    }
LAB_0011d1bc:
    if ((lVar4 < lVar8) && ((this->super_Parser).symbols.d.ptr[lVar4].token == PP_RPAREN)) {
      (this->super_Parser).index = lVar4 + 1;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  }
LAB_0011d200:
  Parser::error(&this->super_Parser,(char *)0x0);
LAB_0011d07a:
  if ((lVar4 < lVar8) && (pSVar7 = (this->super_Parser).symbols.d.ptr, pSVar7[lVar4].token == COLON)
     ) {
    lVar1 = lVar4 + 1;
    (this->super_Parser).index = lVar1;
    if ((lVar1 < lVar8) && (pSVar7[lVar1].token == IDENTIFIER)) {
      (this->super_Parser).index = lVar4 + 2;
      QByteArray::mid((longlong)&local_a8,(longlong)&pSVar7[lVar4 + 1].lex);
      local_88.className.d.d = local_a8.d.d;
      local_88.className.d.ptr = local_a8.d.ptr;
      local_88.className.d.size = local_a8.d.size;
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_88.interfaceId.d.d = (Data *)0x0;
      local_88.interfaceId.d.ptr = (char *)0x0;
      local_88.interfaceId.d.size = 0;
      QtPrivate::QMovableArrayOps<ClassDef::Interface>::emplace<ClassDef::Interface>
                ((QMovableArrayOps<ClassDef::Interface> *)&local_58,local_58.size,&local_88);
      QList<ClassDef::Interface>::end((QList<ClassDef::Interface> *)&local_58);
      if (&(local_88.interfaceId.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.interfaceId.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.interfaceId.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_88.interfaceId.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_88.interfaceId.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_88.className.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_88.className.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_a8.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0011cf64;
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar2 = ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar3 = &(local_a8.d.d)->super_QArrayData;
      do {
        if (iVar2 == 0) {
          QArrayData::deallocate(pQVar3,1,0x10);
        }
LAB_0011cf64:
        do {
          lVar8 = (this->super_Parser).symbols.d.size;
          lVar4 = (this->super_Parser).index;
          if ((lVar8 <= lVar4) ||
             (pSVar7 = (this->super_Parser).symbols.d.ptr, pSVar7[lVar4].token != SCOPE))
          goto LAB_0011d07a;
          (this->super_Parser).index = lVar4 + 1;
          QByteArray::mid((longlong)&local_88,(longlong)&pSVar7[lVar4].lex);
          iVar5 = QList<ClassDef::Interface>::end((QList<ClassDef::Interface> *)&local_58);
          QByteArray::append(&iVar5.i[-1].className);
          if (&(local_88.className.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_88.className.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_88.className.d.d)->super_QArrayData,1,0x10);
            }
          }
          lVar8 = (this->super_Parser).index;
          if (((this->super_Parser).symbols.d.size <= lVar8) ||
             (pSVar7 = (this->super_Parser).symbols.d.ptr, pSVar7[lVar8].token != IDENTIFIER))
          goto LAB_0011d200;
          (this->super_Parser).index = lVar8 + 1;
          QByteArray::mid((longlong)&local_88,(longlong)&pSVar7[lVar8].lex);
          iVar5 = QList<ClassDef::Interface>::end((QList<ClassDef::Interface> *)&local_58);
          QByteArray::append(&iVar5.i[-1].className);
        } while (&(local_88.className.d.d)->super_QArrayData == (QArrayData *)0x0);
        LOCK();
        ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        iVar2 = ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i;
        UNLOCK();
        pQVar3 = &(local_88.className.d.d)->super_QArrayData;
      } while( true );
    }
    goto LAB_0011d200;
  }
  if (local_58.size != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      local_88.className.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.className.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.className.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      local_a8.d.d = (Data *)0x0;
      local_a8.d.ptr = (char *)0x0;
      local_a8.d.size = 0;
      QMap<QByteArray,_QByteArray>::value
                (&local_88.className,&this->interface2IdMap,
                 (QByteArray *)((long)&((local_58.ptr)->className).d.d + lVar8),&local_a8);
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if ((undefined1 *)local_88.className.d.size == (undefined1 *)0x0) {
        Parser::error(&this->super_Parser,"Undefined interface");
      }
      pIVar6 = QList<ClassDef::Interface>::data((QList<ClassDef::Interface> *)&local_58);
      QByteArray::operator=
                ((QByteArray *)((long)&(pIVar6->interfaceId).d.d + lVar8),&local_88.className);
      if (&(local_88.className.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_88.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_88.className.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x30;
    } while (uVar9 < (ulong)local_58.size);
  }
  QtPrivate::QMovableArrayOps<QList<ClassDef::Interface>>::emplace<QList<ClassDef::Interface>const&>
            ((QMovableArrayOps<QList<ClassDef::Interface>> *)&def->interfaceList,
             (def->interfaceList).d.size,(QList<ClassDef::Interface> *)&local_58);
  QList<QList<ClassDef::Interface>_>::end(&def->interfaceList);
  QArrayDataPointer<ClassDef::Interface>::~QArrayDataPointer(&local_58);
  lVar8 = (this->super_Parser).symbols.d.size;
  lVar4 = (this->super_Parser).index;
  if ((lVar8 <= lVar4) ||
     (pSVar7 = (this->super_Parser).symbols.d.ptr, pSVar7[lVar4].token != IDENTIFIER))
  goto LAB_0011d1bc;
  goto LAB_0011cc7e;
}

Assistant:

void Moc::parseInterfaces(ClassDef *def)
{
    next(LPAREN);
    while (test(IDENTIFIER)) {
        QList<ClassDef::Interface> iface;
        iface += ClassDef::Interface(lexem());
        while (test(SCOPE)) {
            iface.last().className += lexem();
            next(IDENTIFIER);
            iface.last().className += lexem();
        }
        while (test(COLON)) {
            next(IDENTIFIER);
            iface += ClassDef::Interface(lexem());
            while (test(SCOPE)) {
                iface.last().className += lexem();
                next(IDENTIFIER);
                iface.last().className += lexem();
            }
        }
        // resolve from classnames to interface ids
        for (qsizetype i = 0; i < iface.size(); ++i) {
            const QByteArray iid = interface2IdMap.value(iface.at(i).className);
            if (iid.isEmpty())
                error("Undefined interface");

            iface[i].interfaceId = iid;
        }
        def->interfaceList += iface;
    }
    next(RPAREN);
}